

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O1

int __thiscall
TPZCompElH1<pzshape::TPZShapeLinear>::EffectiveSideOrder
          (TPZCompElH1<pzshape::TPZShapeLinear> *this,int side)

{
  uint uVar1;
  TPZGeoEl *pTVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  ostream *poVar6;
  uint uVar7;
  TPZStack<int,_10> lowdim;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  long local_198;
  
  uVar7 = 0;
  if (side == 2) {
    if ((this->fConnectIndexes).super_TPZVec<long>.fStore[2] == -1) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_198,
                 "virtual int TPZCompElH1<pzshape::TPZShapeLinear>::EffectiveSideOrder(int) const [TSHAPE = pzshape::TPZShapeLinear]"
                 ,0x72);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," side ",6);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&local_198,2);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_1c8,local_1c0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElH1.cpp"
                 ,0xe6);
    }
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)local_1a8);
    pTVar2 = TPZCompEl::Reference((TPZCompEl *)this);
    (**(code **)(*(long *)pTVar2 + 0x220))(pTVar2,2,local_1a8);
    lVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,2);
    uVar7 = (uint)*(byte *)(lVar3 + 0x14);
    if (0 < local_198) {
      lVar3 = 0;
      do {
        lVar4 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0x318))
                          (this,*(int *)(local_1a8._8_8_ + lVar3 * 4));
        uVar1 = (uint)*(byte *)(lVar4 + 0x14);
        if (*(byte *)(lVar4 + 0x14) < uVar7) {
          uVar1 = uVar7;
        }
        uVar7 = uVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 < local_198);
    }
    TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)local_1a8);
  }
  return uVar7;
}

Assistant:

int TPZCompElH1<TSHAPE>::EffectiveSideOrder(int side) const {

	if(side < TSHAPE::NCornerNodes || side >= TSHAPE::NSides) return 0;
	if(fConnectIndexes[side] == -1)
	{
		std::stringstream sout ;
		sout << __PRETTY_FUNCTION__ << " side " << side << std::endl;
		//Print(sout);
#ifdef PZ_LOG
		LOGPZ_ERROR(logger,sout.str());
#else
		std::cout << sout.str() << std::endl;
#endif
		DebugStop();
		return -1;
	}
    TPZStack<int> lowdim;
    this->Reference()->LowerDimensionSides(side,lowdim);
	TPZConnect &c = this->Connect(side);
	int order = c.Order();
    for (int is=0; is<lowdim.size(); is++) {
        TPZConnect &c = this->MidSideConnect(lowdim[is]);
        if(c.Order() > order) order = c.Order();
    }
    return order;
}